

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall cornerstone::raft_server::commit_in_bg(raft_server *this)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  log_val_type lVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  pointer pcVar6;
  element_type *peVar7;
  undefined4 extraout_var_00;
  element_type *peVar8;
  element_type *peVar9;
  buffer *pbVar10;
  uptr<log_entry_cookie> *puVar11;
  element_type *peVar12;
  element_type *peVar13;
  cluster_config *this_00;
  ulong in_RDI;
  bool bVar14;
  raft_server *unaff_retaddr;
  exception *err;
  ptr<cluster_config> new_conf;
  lock_guard<std::recursive_mutex> guard_1;
  ptr<log_entry> log_entry;
  lock_guard<std::mutex> guard;
  unique_lock<std::mutex> lock;
  ptr<cluster_config> *in_stack_00000378;
  raft_server *in_stack_00000380;
  mutex_type *in_stack_fffffffffffffce8;
  strfmt<100> *in_stack_fffffffffffffcf0;
  log_entry *in_stack_fffffffffffffd00;
  allocator<char> *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined2 in_stack_fffffffffffffd14;
  byte in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  undefined1 uVar15;
  cluster_config *in_stack_fffffffffffffd20;
  element_type *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  buffer *in_stack_fffffffffffffd38;
  allocator<char> local_131;
  string local_130 [39];
  byte local_109;
  undefined1 local_f1 [113];
  string local_80 [56];
  undefined1 local_48 [20];
  uint local_34;
  unique_lock<std::mutex> local_28 [2];
  ulong committed_idx;
  
  committed_idx = in_RDI;
  do {
    while( true ) {
      bVar14 = true;
      if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x18)) {
        uVar1 = *(ulong *)(in_RDI + 0x20);
        peVar5 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bf5fc);
        iVar3 = (*peVar5->_vptr_log_store[2])();
        bVar14 = CONCAT44(extraout_var,iVar3) - 1U <= uVar1;
      }
      if (bVar14) break;
      while( true ) {
        bVar14 = false;
        if (*(ulong *)(in_RDI + 0x20) < *(ulong *)(in_RDI + 0x18)) {
          uVar1 = *(ulong *)(in_RDI + 0x20);
          peVar5 = std::
                   __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1bf7f7);
          iVar3 = (*peVar5->_vptr_log_store[2])();
          bVar14 = uVar1 < CONCAT44(extraout_var_00,iVar3) - 1U;
        }
        if (!bVar14) break;
        *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
        peVar5 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bf85d);
        (*peVar5->_vptr_log_store[8])(local_48,peVar5,*(undefined8 *)(in_RDI + 0x20));
        peVar8 = std::
                 __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bf88c);
        lVar4 = cornerstone::log_entry::get_val_type(peVar8);
        if (lVar4 == app_log) {
          peVar9 = std::
                   __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1bf8c1);
          uVar2 = *(undefined8 *)(in_RDI + 0x20);
          std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1bf8ed);
          pbVar10 = cornerstone::log_entry::get_buf(in_stack_fffffffffffffd00);
          peVar8 = std::
                   __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1bf90c);
          puVar11 = cornerstone::log_entry::get_cookie(peVar8);
          (*peVar9->_vptr_state_machine[2])(peVar9,uVar2,pbVar10,puVar11);
        }
        else {
          peVar8 = std::
                   __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1bf974);
          lVar4 = cornerstone::log_entry::get_val_type(peVar8);
          if (lVar4 == conf) {
            std::lock_guard<std::recursive_mutex>::lock_guard
                      ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffcf0,
                       (mutex_type *)in_stack_fffffffffffffce8);
            std::
            __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1bf9ba);
            cornerstone::log_entry::get_buf(in_stack_fffffffffffffd00);
            buffer::pos((buffer *)
                        CONCAT17(in_stack_fffffffffffffd17,
                                 CONCAT16(in_stack_fffffffffffffd16,
                                          CONCAT24(in_stack_fffffffffffffd14,
                                                   in_stack_fffffffffffffd10))),
                        (size_t)in_stack_fffffffffffffd08);
            std::
            __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1bf9e6);
            cornerstone::log_entry::get_buf(in_stack_fffffffffffffd00);
            cluster_config::deserialize(in_stack_fffffffffffffd38);
            peVar12 = std::
                      __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1bfa1d);
            strfmt<100>::strfmt((strfmt<100> *)(local_f1 + 1),"config at index %llu is committed");
            peVar13 = std::
                      __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1bfa45);
            cluster_config::get_log_idx(peVar13);
            in_stack_fffffffffffffd38 =
                 (buffer *)
                 strfmt<100>::fmt<unsigned_long>
                           (in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
            this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)in_stack_fffffffffffffd28,
                       (allocator<char> *)in_stack_fffffffffffffd20);
            (*peVar12->_vptr_logger[3])(peVar12,local_80);
            std::__cxx11::string::~string(local_80);
            std::allocator<char>::~allocator((allocator<char> *)local_f1);
            std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::
            operator->((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>
                        *)0x1bfadb);
            in_stack_fffffffffffffd28 =
                 std::
                 __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bfae3);
            peVar13 = std::
                      __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)in_stack_fffffffffffffcf0);
            (*in_stack_fffffffffffffd28->_vptr_state_mgr[3])(in_stack_fffffffffffffd28,peVar13);
            *(undefined1 *)(in_RDI + 0x29) = 0;
            peVar13 = std::
                      __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1bfb20);
            in_stack_fffffffffffffd20 = (cluster_config *)cluster_config::get_log_idx(peVar13);
            peVar13 = std::
                      __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1bfb3c);
            this_00 = (cluster_config *)cluster_config::get_log_idx(peVar13);
            if (in_stack_fffffffffffffd20 < this_00) {
              reconfigure(in_stack_00000380,in_stack_00000378);
            }
            local_109 = 0;
            uVar15 = false;
            if ((*(byte *)(in_RDI + 0x2a) & 1) != 0) {
              std::
              __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1bfc1d);
              cluster_config::get_server
                        (this_00,CONCAT13(uVar15,CONCAT12(in_stack_fffffffffffffd16,
                                                          in_stack_fffffffffffffd14)));
              local_109 = 1;
              uVar15 = std::operator!=((shared_ptr<cornerstone::srv_config> *)
                                       in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
            }
            in_stack_fffffffffffffd16 = uVar15;
            in_stack_fffffffffffffd17 = in_stack_fffffffffffffd16;
            if ((local_109 & 1) != 0) {
              std::shared_ptr<cornerstone::srv_config>::~shared_ptr
                        ((shared_ptr<cornerstone::srv_config> *)0x1bfc78);
            }
            if ((in_stack_fffffffffffffd16 & 1) != 0) {
              in_stack_fffffffffffffd00 =
                   (log_entry *)
                   std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1bfc99);
              in_stack_fffffffffffffd08 = &local_131;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_01,(char *)in_stack_fffffffffffffd28,
                         (allocator<char> *)in_stack_fffffffffffffd20);
              (*((_func_int **)in_stack_fffffffffffffd00->term_)[3])
                        (in_stack_fffffffffffffd00,local_130);
              std::__cxx11::string::~string(local_130);
              std::allocator<char>::~allocator(&local_131);
              *(undefined1 *)(in_RDI + 0x2a) = 0;
            }
            std::shared_ptr<cornerstone::cluster_config>::~shared_ptr
                      ((shared_ptr<cornerstone::cluster_config> *)0x1bfd5e);
            std::lock_guard<std::recursive_mutex>::~lock_guard
                      ((lock_guard<std::recursive_mutex> *)0x1bfd6b);
          }
        }
        snapshot_and_compact(unaff_retaddr,committed_idx);
        std::shared_ptr<cornerstone::log_entry>::~shared_ptr
                  ((shared_ptr<cornerstone::log_entry> *)0x1bfdab);
      }
    }
    pcVar6 = std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::
             operator->((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>
                         *)0x1bf654);
    bVar14 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pcVar6->event_listener_);
    if (bVar14) {
      std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
                ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                 0x1bf677);
      peVar7 = std::
               __shared_ptr_access<cornerstone::raft_event_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::raft_event_listener,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1bf683);
      (*peVar7->_vptr_raft_event_listener[2])(peVar7,3);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    std::condition_variable::wait((unique_lock *)(in_RDI + 0x238));
    bVar14 = (*(byte *)(in_RDI + 0x2b) & 1) != 0;
    if (bVar14) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffcf0);
      std::unique_lock<std::mutex>::release(local_28);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      std::condition_variable::notify_all();
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1bf758);
    }
    local_34 = (uint)bVar14;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffcf0)
    ;
  } while (local_34 == 0);
  return;
}

Assistant:

void raft_server::commit_in_bg()
{
    while (true)
    {
        try
        {
            while (quick_commit_idx_ <= sm_commit_index_ || sm_commit_index_ >= log_store_->next_slot() - 1)
            {
                // already catch up all committed logs
                if (ctx_->event_listener_)
                {
                    ctx_->event_listener_->on_event(raft_event::logs_catch_up);
                }

                std::unique_lock<std::mutex> lock(commit_lock_);
                commit_cv_.wait(lock);
                if (stopping_)
                {
                    lock.unlock();
                    lock.release();
                    {
                        auto_lock(stopping_lock_);
                        ready_to_stop_cv_.notify_all();
                    }

                    return;
                }
            }

            while (sm_commit_index_ < quick_commit_idx_ && sm_commit_index_ < log_store_->next_slot() - 1)
            {
                sm_commit_index_ += 1;
                ptr<log_entry> log_entry(log_store_->entry_at(sm_commit_index_));
                if (log_entry->get_val_type() == log_val_type::app_log)
                {
                    state_machine_->commit(sm_commit_index_, log_entry->get_buf(), log_entry->get_cookie());
                }
                else if (log_entry->get_val_type() == log_val_type::conf)
                {
                    recur_lock(lock_);
                    log_entry->get_buf().pos(0);
                    ptr<cluster_config> new_conf = cluster_config::deserialize(log_entry->get_buf());
                    l_->info(sstrfmt("config at index %llu is committed").fmt(new_conf->get_log_idx()));
                    ctx_->state_mgr_->save_config(*new_conf);
                    config_changing_ = false;
                    if (config_->get_log_idx() < new_conf->get_log_idx())
                    {
                        reconfigure(new_conf);
                    }

                    if (catching_up_ && new_conf->get_server(id_) != nilptr)
                    {
                        l_->info("this server is committed as one of cluster members");
                        catching_up_ = false;
                    }
                }

                snapshot_and_compact(sm_commit_index_);
            }
        }
        catch (std::exception& err)
        {
            l_->err(lstrfmt("background committing thread encounter err %s, exiting to protect the system")
                        .fmt(err.what()));
            ctx_->state_mgr_->system_exit(-1);
        }
    }
}